

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O0

opj_bool t2_read_packet_header
                   (opj_t2_v2_t *p_t2,opj_tcd_tile_v2_t *p_tile,opj_tcp_v2_t *p_tcp,
                   opj_pi_iterator_t *p_pi,opj_bool *p_is_data_present,OPJ_BYTE *p_src_data,
                   OPJ_UINT32 *p_data_read,OPJ_UINT32 p_max_length,opj_packet_info_t *p_pack_info)

{
  int iVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  opj_bool oVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  opj_bio_t *bio;
  long lVar9;
  long in_RCX;
  uint *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  uchar *in_R9;
  int *in_stack_00000008;
  int in_stack_00000010;
  OPJ_UINT32 i;
  OPJ_INT32 n;
  OPJ_UINT32 l_segno;
  OPJ_UINT32 l_increment;
  OPJ_UINT32 l_included;
  opj_tcd_precinct_v2_t *l_prc_1;
  opj_tcd_precinct_v2_t *l_prc;
  OPJ_UINT32 l_present;
  OPJ_BYTE **l_header_data_start;
  OPJ_BYTE *l_header_data;
  opj_tcd_resolution_v2_t *l_res;
  opj_tcd_cblk_dec_v2_t *l_cblk;
  opj_tcd_band_v2_t *l_band;
  opj_bio_t *l_bio;
  opj_cp_v2_t *l_cp;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 *l_modified_length_ptr;
  OPJ_UINT32 l_header_length;
  OPJ_UINT32 l_remaining_length;
  OPJ_UINT32 l_nb_code_blocks;
  OPJ_UINT32 cblkno;
  OPJ_UINT32 bandno;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  opj_bio_t *in_stack_ffffffffffffff30;
  OPJ_UINT32 in_stack_ffffffffffffff3c;
  OPJ_UINT32 in_stack_ffffffffffffff40;
  uchar **local_98;
  uchar *local_90;
  long local_80;
  int *local_78;
  uchar *local_60;
  uint *local_58;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uchar *local_38;
  undefined4 *local_30;
  long local_28;
  uint *local_20;
  opj_bool local_4;
  
  local_58 = (uint *)0x0;
  lVar9 = *(long *)(in_RDI + 0x10);
  lVar7 = *(long *)(*(long *)(in_RSI + 0x18) + (long)*(int *)(in_RCX + 0x20) * 0x38 + 0x18) +
          (long)*(int *)(in_RCX + 0x24) * 0xb0;
  local_60 = in_R9;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  if (*(int *)(in_RCX + 0x2c) == 0) {
    local_78 = (int *)(lVar7 + 0x20);
    for (local_3c = 0; local_3c < *(uint *)(lVar7 + 0x18); local_3c = local_3c + 1) {
      lVar8 = *(long *)(local_78 + 6) + (long)*(int *)(local_28 + 0x28) * 0x38;
      if ((local_78[2] != *local_78) && (local_78[3] != local_78[1])) {
        tgt_reset(*(opj_tgt_tree_t **)(lVar8 + 0x28));
        tgt_reset(*(opj_tgt_tree_t **)(lVar8 + 0x30));
        local_80 = *(long *)(lVar8 + 0x18);
        local_44 = *(int *)(lVar8 + 0x10) * *(int *)(lVar8 + 0x14);
        for (local_40 = 0; local_40 < local_44; local_40 = local_40 + 1) {
          *(undefined4 *)(local_80 + 0x30) = 0;
          *(undefined4 *)(local_80 + 0x34) = 0;
          local_80 = local_80 + 0x40;
        }
      }
      local_78 = local_78 + 0xc;
    }
  }
  if ((((*local_20 & 2) != 0) && (*local_60 == 0xff)) && (local_60[1] == 0x91)) {
    local_60 = local_60 + 6;
  }
  bio = bio_create();
  if (bio == (opj_bio_t *)0x0) {
    local_4 = 0;
  }
  else {
    if ((*(byte *)(lVar9 + 0x88) & 1) == 1) {
      local_98 = (uchar **)(lVar9 + 0x28);
      local_90 = *local_98;
      local_58 = (uint *)(lVar9 + 0x30);
    }
    else if ((local_20[0x58a] & 1) == 1) {
      local_98 = (uchar **)(local_20 + 0x50a);
      local_90 = *local_98;
      local_58 = local_20 + 0x50f;
    }
    else {
      local_98 = &local_60;
      local_90 = local_60;
      local_48 = ((int)local_38 + in_stack_00000010) - (int)local_60;
      local_58 = &local_48;
    }
    bio_init_dec(bio,local_90,*local_58);
    iVar1 = bio_read(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    if (iVar1 == 0) {
      bio_inalign((opj_bio_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      iVar1 = bio_numbytes(bio);
      local_90 = local_90 + iVar1;
      bio_destroy((opj_bio_t *)0x169f0f);
      if ((*local_20 & 4) != 0) {
        if ((*local_90 == 0xff) && (local_90[1] == 0x92)) {
          local_90 = local_90 + 2;
        }
        else {
          printf("Error : expected EPH marker\n");
        }
      }
      uVar2 = (int)local_90 - (int)*local_98;
      *local_58 = *local_58 - uVar2;
      *local_98 = *local_98 + uVar2;
      if (_n != 0) {
        *(long *)(_n + 8) = (long)((int)local_60 - (int)local_38);
      }
      *local_30 = 0;
      *in_stack_00000008 = (int)local_60 - (int)local_38;
      local_4 = 1;
    }
    else {
      local_78 = (int *)(lVar7 + 0x20);
      for (local_3c = 0; local_3c < *(uint *)(lVar7 + 0x18); local_3c = local_3c + 1) {
        lVar9 = *(long *)(local_78 + 6) + (long)*(int *)(local_28 + 0x28) * 0x38;
        if ((local_78[2] != *local_78) && (local_78[3] != local_78[1])) {
          local_44 = *(int *)(lVar9 + 0x10) * *(int *)(lVar9 + 0x14);
          local_80 = *(long *)(lVar9 + 0x18);
          for (local_40 = 0; local_40 < local_44; local_40 = local_40 + 1) {
            if (*(int *)(local_80 + 0x30) == 0) {
              OVar3 = tgt_decode((opj_bio_t *)l_res,(opj_tgt_tree_t *)l_header_data,
                                 l_header_data_start._4_4_,(OPJ_INT32)l_header_data_start);
            }
            else {
              OVar3 = bio_read(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
            }
            if (OVar3 == 0) {
              *(undefined4 *)(local_80 + 0x2c) = 0;
            }
            else {
              if (*(int *)(local_80 + 0x30) == 0) {
                in_stack_ffffffffffffff3c = 0;
                while (OVar4 = tgt_decode((opj_bio_t *)l_res,(opj_tgt_tree_t *)l_header_data,
                                          l_header_data_start._4_4_,(OPJ_INT32)l_header_data_start),
                      OVar4 == 0) {
                  in_stack_ffffffffffffff3c = in_stack_ffffffffffffff3c + 1;
                }
                *(OPJ_UINT32 *)(local_80 + 0x20) = (local_78[9] + 1) - in_stack_ffffffffffffff3c;
                *(undefined4 *)(local_80 + 0x24) = 3;
              }
              iVar1 = t2_getnumpasses((opj_bio_t *)
                                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
              ;
              *(int *)(local_80 + 0x2c) = iVar1;
              iVar1 = t2_getcommacode(in_stack_ffffffffffffff30);
              *(int *)(local_80 + 0x24) = iVar1 + *(int *)(local_80 + 0x24);
              uVar2 = 0;
              if (*(int *)(local_80 + 0x30) == 0) {
                oVar5 = t2_init_seg_v2((opj_tcd_cblk_dec_v2_t *)CONCAT44(OVar3,iVar1),0,
                                       in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
                if (oVar5 == 0) {
                  bio_destroy((opj_bio_t *)0x16a246);
                  return 0;
                }
              }
              else {
                OVar4 = *(OPJ_UINT32 *)(local_80 + 0x30);
                uVar2 = OVar4 - 1;
                if ((*(int *)(*(long *)(local_80 + 8) + (ulong)uVar2 * 0x28 + 0xc) ==
                     *(int *)(*(long *)(local_80 + 8) + (ulong)uVar2 * 0x28 + 0x18)) &&
                   (oVar5 = t2_init_seg_v2((opj_tcd_cblk_dec_v2_t *)CONCAT44(OVar3,iVar1),OVar4,
                                           in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c),
                   uVar2 = OVar4, oVar5 == 0)) {
                  bio_destroy((opj_bio_t *)0x16a2ec);
                  return 0;
                }
              }
              in_stack_ffffffffffffff40 = *(OPJ_UINT32 *)(local_80 + 0x2c);
              do {
                iVar6 = int_min(*(int *)(*(long *)(local_80 + 8) + (ulong)uVar2 * 0x28 + 0x18) -
                                *(int *)(*(long *)(local_80 + 8) + (ulong)uVar2 * 0x28 + 0xc),
                                in_stack_ffffffffffffff40);
                *(int *)(*(long *)(local_80 + 8) + (ulong)uVar2 * 0x28 + 0x1c) = iVar6;
                in_stack_ffffffffffffff2c = *(int *)(local_80 + 0x24);
                in_stack_ffffffffffffff30 = bio;
                uint_floorlog2(*(OPJ_UINT32 *)(*(long *)(local_80 + 8) + (ulong)uVar2 * 0x28 + 0x1c)
                              );
                iVar6 = bio_read(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
                *(int *)(*(long *)(local_80 + 8) + (ulong)uVar2 * 0x28 + 0x20) = iVar6;
                in_stack_ffffffffffffff40 =
                     in_stack_ffffffffffffff40 -
                     *(int *)(*(long *)(local_80 + 8) + (ulong)uVar2 * 0x28 + 0x1c);
                if (0 < (int)in_stack_ffffffffffffff40) {
                  uVar2 = uVar2 + 1;
                  oVar5 = t2_init_seg_v2((opj_tcd_cblk_dec_v2_t *)CONCAT44(OVar3,iVar1),uVar2,
                                         in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
                  if (oVar5 == 0) {
                    bio_destroy((opj_bio_t *)0x16a431);
                    return 0;
                  }
                }
              } while (0 < (int)in_stack_ffffffffffffff40);
            }
            local_80 = local_80 + 0x40;
          }
        }
        local_78 = local_78 + 0xc;
      }
      iVar1 = bio_inalign((opj_bio_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                         );
      if (iVar1 == 0) {
        iVar1 = bio_numbytes(bio);
        local_90 = local_90 + iVar1;
        bio_destroy((opj_bio_t *)0x16a4e7);
        if ((((*local_20 & 4) != 0) && (*local_90 == 0xff)) && (local_90[1] == 0x92)) {
          local_90 = local_90 + 2;
        }
        uVar2 = (int)local_90 - (int)*local_98;
        *local_58 = *local_58 - uVar2;
        *local_98 = *local_98 + uVar2;
        if (_n != 0) {
          *(long *)(_n + 8) = (long)((int)local_60 - (int)local_38);
        }
        *local_30 = 1;
        *in_stack_00000008 = (int)local_60 - (int)local_38;
        local_4 = 1;
      }
      else {
        bio_destroy((opj_bio_t *)0x16a4b1);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static opj_bool t2_read_packet_header(
							 opj_t2_v2_t* p_t2,
							 opj_tcd_tile_v2_t *p_tile,
                             opj_tcp_v2_t *p_tcp,
							 opj_pi_iterator_t *p_pi,
							 opj_bool * p_is_data_present,
							 OPJ_BYTE *p_src_data,
							 OPJ_UINT32 * p_data_read,
							 OPJ_UINT32 p_max_length,
							 opj_packet_info_t *p_pack_info)
{
	/* loop */
	OPJ_UINT32 bandno, cblkno;
	OPJ_UINT32 l_nb_code_blocks;
	OPJ_UINT32 l_remaining_length;
	OPJ_UINT32 l_header_length;
	OPJ_UINT32 * l_modified_length_ptr = 00;
	OPJ_BYTE *l_current_data = p_src_data;
	opj_cp_v2_t *l_cp = p_t2->cp;
	opj_bio_t *l_bio = 00;	/* BIO component */
	opj_tcd_band_v2_t *l_band = 00;
	opj_tcd_cblk_dec_v2_t* l_cblk = 00;
	opj_tcd_resolution_v2_t* l_res = &p_tile->comps[p_pi->compno].resolutions[p_pi->resno];

	OPJ_BYTE *l_header_data = 00;
	OPJ_BYTE **l_header_data_start = 00;

	OPJ_UINT32 l_present;

	if (p_pi->layno == 0) {
		l_band = l_res->bands;

		/* reset tagtrees */
		for (bandno = 0; bandno < l_res->numbands; ++bandno) {
			opj_tcd_precinct_v2_t *l_prc = &l_band->precincts[p_pi->precno];

			if ( ! ((l_band->x1-l_band->x0 == 0)||(l_band->y1-l_band->y0 == 0)) ) {
				tgt_reset(l_prc->incltree);
				tgt_reset(l_prc->imsbtree);
				l_cblk = l_prc->cblks.dec;

				l_nb_code_blocks = l_prc->cw * l_prc->ch;
				for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno) {
					l_cblk->numsegs = 0;
					l_cblk->real_num_segs = 0;
					++l_cblk;
				}
			}

			++l_band;
		}
	}

	/* SOP markers */

	if (p_tcp->csty & J2K_CP_CSTY_SOP) {
		if ((*l_current_data) != 0xff || (*(l_current_data + 1) != 0x91)) {
			/* TODO opj_event_msg(t2->cinfo->event_mgr, EVT_WARNING, "Expected SOP marker\n"); */
		} else {
			l_current_data += 6;
		}

		/** TODO : check the Nsop value */
	}

	/*
	When the marker PPT/PPM is used the packet header are store in PPT/PPM marker
	This part deal with this caracteristic
	step 1: Read packet header in the saved structure
	step 2: Return to codestream for decoding
	*/

	l_bio = bio_create();
	if (! l_bio) {
		return OPJ_FALSE;
	}

	if (l_cp->ppm == 1) { /* PPM */
		l_header_data_start = &l_cp->ppm_data;
		l_header_data = *l_header_data_start;
		l_modified_length_ptr = &(l_cp->ppm_len);

	}
	else if (p_tcp->ppt == 1) { /* PPT */
		l_header_data_start = &(p_tcp->ppt_data);
		l_header_data = *l_header_data_start;
		l_modified_length_ptr = &(p_tcp->ppt_len);
	}
	else {	/* Normal Case */
		l_header_data_start = &(l_current_data);
		l_header_data = *l_header_data_start;
		l_remaining_length = p_src_data+p_max_length-l_header_data;
		l_modified_length_ptr = &(l_remaining_length);
	}

	bio_init_dec(l_bio, l_header_data,*l_modified_length_ptr);

	l_present = bio_read(l_bio, 1);
	if (!l_present) {
		bio_inalign(l_bio);
		l_header_data += bio_numbytes(l_bio);
		bio_destroy(l_bio);

		/* EPH markers */
		if (p_tcp->csty & J2K_CP_CSTY_EPH) {
			if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
				printf("Error : expected EPH marker\n");
			} else {
				l_header_data += 2;
			}
		}

		l_header_length = (l_header_data - *l_header_data_start);
		*l_modified_length_ptr -= l_header_length;
		*l_header_data_start += l_header_length;

		/* << INDEX */
		/* End of packet header position. Currently only represents the distance to start of packet
		   Will be updated later by incrementing with packet start value */
		if (p_pack_info) {
			p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
		}
		/* INDEX >> */

		* p_is_data_present = OPJ_FALSE;
		*p_data_read = l_current_data - p_src_data;
		return OPJ_TRUE;
	}

	l_band = l_res->bands;
	for (bandno = 0; bandno < l_res->numbands; ++bandno) {
		opj_tcd_precinct_v2_t *l_prc = &(l_band->precincts[p_pi->precno]);

		if ((l_band->x1-l_band->x0 == 0)||(l_band->y1-l_band->y0 == 0)) {
			++l_band;
			continue;
		}

		l_nb_code_blocks = l_prc->cw * l_prc->ch;
		l_cblk = l_prc->cblks.dec;
		for (cblkno = 0; cblkno < l_nb_code_blocks; cblkno++) {
			OPJ_UINT32 l_included,l_increment, l_segno;
			OPJ_INT32 n;

			/* if cblk not yet included before --> inclusion tagtree */
			if (!l_cblk->numsegs) {
				l_included = tgt_decode(l_bio, l_prc->incltree, cblkno, p_pi->layno + 1);
				/* else one bit */
			}
			else {
				l_included = bio_read(l_bio, 1);
			}

			/* if cblk not included */
			if (!l_included) {
				l_cblk->numnewpasses = 0;
				++l_cblk;
				continue;
			}

			/* if cblk not yet included --> zero-bitplane tagtree */
			if (!l_cblk->numsegs) {
				OPJ_UINT32 i = 0;

				while (!tgt_decode(l_bio, l_prc->imsbtree, cblkno, i)) {
					++i;
				}

				l_cblk->numbps = l_band->numbps + 1 - i;
				l_cblk->numlenbits = 3;
			}

			/* number of coding passes */
			l_cblk->numnewpasses = t2_getnumpasses(l_bio);
			l_increment = t2_getcommacode(l_bio);

			/* length indicator increment */
			l_cblk->numlenbits += l_increment;
			l_segno = 0;

			if (!l_cblk->numsegs) {
				if (! t2_init_seg_v2(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 1)) {
					bio_destroy(l_bio);
					return OPJ_FALSE;
				}
			}
			else {
				l_segno = l_cblk->numsegs - 1;
				if (l_cblk->segs[l_segno].numpasses == l_cblk->segs[l_segno].maxpasses) {
					++l_segno;
					if (! t2_init_seg_v2(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
						bio_destroy(l_bio);
						return OPJ_FALSE;
					}
				}
			}
			n = l_cblk->numnewpasses;

			do {
				l_cblk->segs[l_segno].numnewpasses = int_min(l_cblk->segs[l_segno].maxpasses - l_cblk->segs[l_segno].numpasses, n);
				l_cblk->segs[l_segno].newlen = bio_read(l_bio, l_cblk->numlenbits + uint_floorlog2(l_cblk->segs[l_segno].numnewpasses));

				n -= l_cblk->segs[l_segno].numnewpasses;
				if (n > 0) {
					++l_segno;

					if (! t2_init_seg_v2(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
						bio_destroy(l_bio);
						return OPJ_FALSE;
					}
				}
			} while (n > 0);

			++l_cblk;
		}

		++l_band;
	}

	if (bio_inalign(l_bio)) {
		bio_destroy(l_bio);
		return OPJ_FALSE;
	}

	l_header_data += bio_numbytes(l_bio);
	bio_destroy(l_bio);

	/* EPH markers */
	if (p_tcp->csty & J2K_CP_CSTY_EPH) {
		if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
			/* TODO opj_event_msg(t2->cinfo->event_mgr, EVT_ERROR, "Expected EPH marker\n"); */
		} else {
			l_header_data += 2;
		}
	}

	l_header_length = (l_header_data - *l_header_data_start);
	*l_modified_length_ptr -= l_header_length;
	*l_header_data_start += l_header_length;

	/* << INDEX */
	/* End of packet header position. Currently only represents the distance to start of packet
	 Will be updated later by incrementing with packet start value */
	if (p_pack_info) {
		p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
	}
	/* INDEX >> */

	*p_is_data_present = OPJ_TRUE;
	*p_data_read = l_current_data - p_src_data;

	return OPJ_TRUE;
}